

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packets.h
# Opt level: O0

void __thiscall ThrowPacket::ThrowPacket(ThrowPacket *this,ptr<Value> *value)

{
  shared_ptr<Value> local_28;
  ptr<Value> *local_18;
  ptr<Value> *value_local;
  ThrowPacket *this_local;
  
  local_18 = value;
  value_local = (ptr<Value> *)this;
  std::shared_ptr<Value>::shared_ptr(&local_28,value);
  CarrierPacket::CarrierPacket(&this->super_CarrierPacket,&local_28);
  std::shared_ptr<Value>::~shared_ptr(&local_28);
  return;
}

Assistant:

explicit ThrowPacket(ptr<Value> value) : CarrierPacket(std::move(value)) { }